

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O1

int __thiscall
vector<server::clientinfo_*>::remove(vector<server::clientinfo_*> *this,char *__filename)

{
  int iVar1;
  clientinfo *pcVar2;
  long lVar3;
  
  lVar3 = (long)(int)__filename;
  pcVar2 = this->buf[lVar3];
  iVar1 = this->ulen;
  if ((int)__filename + 1 < iVar1) {
    do {
      this->buf[lVar3] = this->buf[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (iVar1 + -1 != (int)lVar3);
  }
  this->ulen = iVar1 + -1;
  return (int)pcVar2;
}

Assistant:

T remove(int i)
    {
        T e = buf[i];
        for(int p = i+1; p<ulen; p++) buf[p-1] = buf[p];
        ulen--;
        return e;
    }